

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_rules.cpp
# Opt level: O0

int64_t duckdb::ImplicitCastTinyint(LogicalType *to)

{
  LogicalTypeId LVar1;
  LogicalType *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  int64_t local_8;
  
  LVar1 = LogicalType::id(in_RDI);
  if ((((byte)(LVar1 - SMALLINT) < 3) || ((byte)(LVar1 - DECIMAL) < 3)) || (LVar1 == HUGEINT)) {
    local_8 = TargetTypeCost((LogicalType *)CONCAT17(LVar1,in_stack_ffffffffffffffe8));
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static int64_t ImplicitCastTinyint(const LogicalType &to) {
	switch (to.id()) {
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
	case LogicalTypeId::DECIMAL:
		return TargetTypeCost(to);
	default:
		return -1;
	}
}